

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOStream.cpp
# Opt level: O3

void __thiscall Assimp::DefaultIOStream::~DefaultIOStream(DefaultIOStream *this)

{
  pointer pcVar1;
  
  (this->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__DefaultIOStream_00943a90;
  if ((FILE *)this->mFile != (FILE *)0x0) {
    fclose((FILE *)this->mFile);
    this->mFile = (FILE *)0x0;
  }
  pcVar1 = (this->mFilename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mFilename).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

DefaultIOStream::~DefaultIOStream()
{
    if (mFile) {
        ::fclose(mFile);
        mFile = nullptr;
    }
}